

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlGenerator.cpp
# Opt level: O2

void __thiscall YamlGenerator::generate(YamlGenerator *this,ostream *output,ScName *stmName)

{
  ScModel *pSVar1;
  ostream *poVar2;
  char *pcVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  ScRegion *region;
  _Base_ptr local_60;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  pSVar1 = (this->super_AbstractGenerator).m_model;
  if (stmName->_M_string_length != 0) {
    std::operator<<(output,"Note: discarding a state-machine name\n");
  }
  for (p_Var7 = (pSVar1->m_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &(pSVar1->m_states)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    poVar2 = std::operator<<(output,(string *)(p_Var7 + 1));
    std::operator<<(poVar2,":\n");
    if (p_Var7[2]._M_parent != (_Base_ptr)0x0) {
      poVar2 = std::operator<<(output,"  parent: ");
      poVar2 = std::operator<<(poVar2,(string *)(p_Var7 + 2));
      std::operator<<(poVar2,"\n");
    }
    if (p_Var7[3]._M_color != _S_red) {
      std::operator<<(output,"  history:\n");
      poVar2 = std::operator<<(output,"    mode: ");
      pcVar3 = toString(p_Var7[3]._M_color);
      poVar2 = std::operator<<(poVar2,pcVar3);
      std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<(output,"    initial: ");
      poVar2 = std::operator<<(poVar2,(string *)&p_Var7[3]._M_parent);
      std::operator<<(poVar2,"\n");
    }
    p_Var6 = p_Var7[4]._M_parent;
    local_60 = p_Var7[4]._M_left;
    if (p_Var6 != local_60) {
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      if (1 < (ulong)(((long)local_60 - (long)p_Var6) / 0x50)) {
        std::operator<<(output,"  regions:\n");
        std::__cxx11::string::assign((char *)&local_50);
        p_Var6 = p_Var7[4]._M_parent;
        local_60 = p_Var7[4]._M_left;
      }
      for (; p_Var6 != local_60; p_Var6 = (_Base_ptr)&p_Var6[2]._M_left) {
        poVar2 = std::operator<<(output,(string *)&local_50);
        poVar2 = std::operator<<(poVar2,"  initial: ");
        poVar2 = std::operator<<(poVar2,(string *)p_Var6);
        std::operator<<(poVar2,"\n");
        poVar2 = std::operator<<(output,(string *)&local_50);
        std::operator<<(poVar2,"  substates:\n");
        for (p_Var4 = p_Var6[1]._M_right; p_Var4 != (_Base_ptr)&p_Var6[1]._M_parent;
            p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
          poVar2 = std::operator<<(output,(string *)&local_50);
          poVar2 = std::operator<<(poVar2,"    - ");
          poVar2 = std::operator<<(poVar2,(string *)(p_Var4 + 1));
          std::operator<<(poVar2,"\n");
        }
      }
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (p_Var7[6]._M_parent != (_Base_ptr)0x0) {
      std::operator<<(output,"  transitions:\n");
      for (p_Var6 = p_Var7[5]._M_right; p_Var6 != (_Base_ptr)&p_Var7[5]._M_parent;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        poVar2 = std::operator<<(output,"    - target: ");
        poVar2 = std::operator<<(poVar2,(string *)(p_Var6 + 1));
        std::operator<<(poVar2,"\n");
        if (p_Var6[2]._M_color != _S_red) {
          poVar2 = std::operator<<(output,"      history: ");
          pcVar3 = toString(p_Var6[2]._M_color);
          poVar2 = std::operator<<(poVar2,pcVar3);
          std::operator<<(poVar2,"\n");
        }
        std::operator<<(output,"      events:\n");
        for (p_Var5 = *(_Rb_tree_node_base **)(p_Var6 + 3);
            p_Var5 != (_Rb_tree_node_base *)&p_Var6[2]._M_left;
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
          poVar2 = std::operator<<(output,"        - ");
          poVar2 = std::operator<<(poVar2,(string *)(p_Var5 + 1));
          std::operator<<(poVar2,"\n");
        }
      }
    }
    if (p_Var7[7]._M_right != (_Base_ptr)0x0) {
      std::operator<<(output,"  deferrals:\n");
      for (p_Var6 = p_Var7[7]._M_parent; p_Var6 != (_Base_ptr)&p_Var7[6]._M_right;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        poVar2 = std::operator<<(output,"    - ");
        poVar2 = std::operator<<(poVar2,(string *)(p_Var6 + 1));
        std::operator<<(poVar2,"\n");
      }
    }
    std::operator<<(output,"\n");
  }
  std::ostream::flush();
  return;
}

Assistant:

void YamlGenerator::generate(std::ostream &output, const ScName &stmName)
{
    const auto &states = m_model.states();

    if (!stmName.empty()) {
        output << "Note: discarding a state-machine name\n";
    }

    for (const auto &[name, state] : states) {
        output << name << ":\n";
        if (state.isDefined()) {
            output << "  parent: " << state.parent << "\n";
        }

        print(output, state.historyState);
        print(output, state.regions);
        print(output, state.transitions);
        print(output, state.deferrals);

        output << "\n";
    }

    output.flush();
}